

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::DefineGroupNode::AnnotatePass3
          (DefineGroupNode *this,Compiler *compiler,CountDomain accumConsumes,
          CharSet<char16_t> *accumFollow,bool accumFollowIrrefutable,bool accumFollowEOL)

{
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).followConsumes = accumConsumes;
  (this->super_Node).followSet = accumFollow;
  *(uint *)&(this->super_Node).field_0xc =
       (int)CONCAT71(in_register_00000089,accumFollowEOL) * 0x100 +
       (int)CONCAT71(in_register_00000081,accumFollowIrrefutable) * 4 |
       *(uint *)&(this->super_Node).field_0xc & 0xfffffefb;
  (*this->body->_vptr_Node[9])
            (this->body,compiler,accumConsumes,accumFollow,
             CONCAT71(in_register_00000081,accumFollowIrrefutable) & 0xffffffff);
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffbfff |
       *(uint *)&this->body->field_0xc & 0x4000;
  return;
}

Assistant:

void DefineGroupNode::AnnotatePass3(Compiler& compiler, CountDomain accumConsumes, CharSet<Char>* accumFollow, bool accumFollowIrrefutable, bool accumFollowEOL)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        followConsumes = accumConsumes;
        followSet = accumFollow;
        isFollowIrrefutable = accumFollowIrrefutable;
        isFollowEOL = accumFollowEOL;
        body->AnnotatePass3(compiler, accumConsumes, accumFollow, accumFollowIrrefutable, accumFollowEOL);

        hasInitialHardFailBOI = body->hasInitialHardFailBOI;
    }